

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

void linsolve_lower(double *L,int N,double *b,double *x)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double *__ptr;
  double *col;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  
  lVar4 = (long)N;
  __ptr = (double *)malloc(lVar4 * 8);
  col = (double *)malloc(lVar4 * 8 * lVar4);
  uVar3 = (ulong)(uint)N;
  if (0 < N) {
    iVar9 = 0;
    uVar6 = 0;
    do {
      __ptr[uVar6] = 0.0;
      x[uVar6] = 0.0;
      if ((L[iVar9] == 0.0) && (!NAN(L[iVar9]))) {
        printf("The Matrix system does not have a unique solution");
        exit(1);
      }
      uVar6 = uVar6 + 1;
      iVar9 = iVar9 + N + 1;
    } while (uVar3 != uVar6);
  }
  *__ptr = *b / *L;
  if (1 < N) {
    pdVar5 = L + uVar3;
    uVar6 = 1;
    do {
      dVar10 = 0.0;
      uVar8 = 0;
      do {
        dVar10 = dVar10 + __ptr[uVar8] * pdVar5[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      __ptr[uVar6] = (b[uVar6] - dVar10) / L[uVar6 * uVar3 + uVar6];
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + uVar3;
    } while (uVar6 != uVar3);
  }
  mtranspose(L,N,N,col);
  x[lVar4 + -1] = __ptr[lVar4 + -1] / col[(ulong)(uint)(N * N) - 1];
  if (1 < N) {
    lVar4 = (long)(N + -2);
    pdVar7 = col + lVar4 * (uVar3 + 1) + 1;
    pdVar5 = x + (N - 1);
    uVar6 = 1;
    do {
      dVar10 = 0.0;
      if (lVar4 < (long)(uVar3 - 1)) {
        uVar8 = 0;
        do {
          pdVar1 = pdVar7 + uVar8;
          pdVar2 = pdVar5 + uVar8;
          uVar8 = uVar8 + 1;
          dVar10 = dVar10 + *pdVar1 * *pdVar2;
        } while (uVar6 != uVar8);
      }
      x[lVar4] = (__ptr[lVar4] - dVar10) / col[lVar4 * (uVar3 + 1)];
      lVar4 = lVar4 + -1;
      uVar6 = uVar6 + 1;
      pdVar7 = (double *)((long)pdVar7 - (uVar3 * 8 + 8));
      pdVar5 = pdVar5 + -1;
    } while (uVar6 != uVar3);
  }
  free(__ptr);
  free(col);
  return;
}

Assistant:

void linsolve_lower(double *L,int N,double *b,double *x) {
	int i,j,c1,l;
	double *y,*A;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	A = (double*) malloc(sizeof(double) *N *N);
	
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( L[i*N + i] == 0.) {
			printf("The Matrix system does not have a unique solution");
			exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[0]/L[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * L[c1 + j];
		}
		y[i] = (b[i] - sum)/L[c1+i];
	}
	
	mtranspose(L,N,N,A);
	
	//Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
	free(A);
}